

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O2

int inxsearch(nn_quant *nnq,int al,int b,int g,int r)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  nq_pixel *paiVar9;
  int iVar10;
  int iVar11;
  
  iVar6 = nnq->netindex[g];
  iVar1 = nnq->netsize;
  iVar3 = -1;
  iVar4 = 1000;
  uVar2 = (ulong)(iVar6 - 1);
  while (uVar7 = uVar2, iVar5 = (int)uVar7, iVar6 < iVar1 || -1 < iVar5) {
    iVar11 = iVar6;
    if (iVar6 < iVar1) {
      iVar10 = nnq->network[iVar6][2] - g;
      iVar11 = iVar1;
      if (iVar10 < iVar4) {
        paiVar9 = nnq->network + iVar6;
        iVar11 = -iVar10;
        if (0 < iVar10) {
          iVar11 = iVar10;
        }
        iVar8 = (*paiVar9)[1] - b;
        iVar10 = -iVar8;
        if (0 < iVar8) {
          iVar10 = iVar8;
        }
        iVar10 = iVar10 + iVar11;
        if (iVar10 < iVar4) {
          iVar8 = (*paiVar9)[3] - r;
          iVar11 = -iVar8;
          if (0 < iVar8) {
            iVar11 = iVar8;
          }
          iVar10 = iVar10 + iVar11;
        }
        if (iVar10 < iVar4) {
          iVar8 = (*paiVar9)[0] - al;
          iVar11 = -iVar8;
          if (0 < iVar8) {
            iVar11 = iVar8;
          }
          iVar10 = iVar10 + iVar11;
        }
        iVar11 = iVar6 + 1;
        if (iVar10 < iVar4) {
          iVar3 = (*paiVar9)[4];
          iVar4 = iVar10;
        }
      }
    }
    iVar6 = iVar11;
    uVar2 = uVar7;
    if (-1 < iVar5) {
      iVar11 = g - nnq->network[uVar7][2];
      uVar2 = 0xffffffff;
      if (iVar11 < iVar4) {
        paiVar9 = nnq->network + uVar7;
        iVar10 = -iVar11;
        if (0 < iVar11) {
          iVar10 = iVar11;
        }
        iVar8 = (*paiVar9)[1] - b;
        iVar11 = -iVar8;
        if (0 < iVar8) {
          iVar11 = iVar8;
        }
        iVar11 = iVar11 + iVar10;
        if (iVar11 < iVar4) {
          iVar8 = (*paiVar9)[3] - r;
          iVar10 = -iVar8;
          if (0 < iVar8) {
            iVar10 = iVar8;
          }
          iVar11 = iVar11 + iVar10;
        }
        if (iVar11 < iVar4) {
          iVar8 = (*paiVar9)[0] - al;
          iVar10 = -iVar8;
          if (0 < iVar8) {
            iVar10 = iVar8;
          }
          iVar11 = iVar11 + iVar10;
        }
        uVar2 = (ulong)(iVar5 - 1U);
        if (iVar11 < iVar4) {
          iVar3 = (*paiVar9)[4];
          iVar4 = iVar11;
          uVar2 = (ulong)(iVar5 - 1U);
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int inxsearch(nnq, al,b,g,r)
nn_quant *nnq;
register int al, b, g, r;
{
	register int i, j, dist, a, bestd;
	register int *p;
	int best;

	bestd = 1000;		/* biggest possible dist is 256*3 */
	best = -1;
	i = nnq->netindex[g];	/* index on g */
	j = i-1;		/* start at netindex[g] and work outwards */

	while ((i<nnq->netsize) || (j>=0)) {
		if (i< nnq->netsize) {
			p = nnq->network[i];
			dist = p[2] - g;		/* inx key */
			if (dist >= bestd) i = nnq->netsize;	/* stop iter */
			else {
				i++;
				if (dist<0) dist = -dist;
				a = p[1] - b;
				if (a<0) a = -a;
				dist += a;
				if (dist<bestd) {
					a = p[3] - r;
					if (a<0) a = -a;
					dist += a;
				}
				if(dist<bestd) {
					a = p[0] - al;
					if (a<0) a = -a;
					dist += a;
				}
				if (dist<bestd) {
					bestd=dist;
					best=p[4];
				}
			}
		}

		if (j>=0) {
			p = nnq->network[j];
			dist = g - p[2]; /* inx key - reverse dif */
			if (dist >= bestd) j = -1; /* stop iter */
			else {
				j--;
				if (dist<0) dist = -dist;
				a = p[1] - b;
				if (a<0) a = -a;
				dist += a;
				if (dist<bestd) {
					a = p[3] - r;
					if (a<0) a = -a;
					dist += a;
				}
				if(dist<bestd) {
					a = p[0] - al;
					if (a<0) a = -a;
					dist += a;
				}
				if (dist<bestd) {
					bestd=dist;
					best=p[4];
				}
			}
		}
	}

	return(best);
}